

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent_coop_notifications.cpp
# Opt level: O0

coop_reg_notificator_t * __thiscall
so_5::make_coop_reg_notificator_abi_cxx11_
          (coop_reg_notificator_t *__return_storage_ptr__,so_5 *this,mbox_t *mbox)

{
  intrusive_ptr_t<so_5::abstract_message_box_t> local_20;
  so_5 *local_18;
  mbox_t *mbox_local;
  
  local_18 = this;
  mbox_local = (mbox_t *)__return_storage_ptr__;
  intrusive_ptr_t<so_5::abstract_message_box_t>::intrusive_ptr_t
            (&local_20,(intrusive_ptr_t<so_5::abstract_message_box_t> *)this);
  std::function<void(so_5::environment_t&,std::__cxx11::string_const&)>::
  function<so_5::make_coop_reg_notificator(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&)::__0,void>
            ((function<void(so_5::environment_t&,std::__cxx11::string_const&)> *)
             __return_storage_ptr__,(anon_class_8_1_898eb73c *)&local_20);
  make_coop_reg_notificator[abi:cxx11](so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&)::
  $_0::~__0((__0 *)&local_20);
  return __return_storage_ptr__;
}

Assistant:

SO_5_FUNC coop_reg_notificator_t
make_coop_reg_notificator(
	const mbox_t & mbox )
	{
		return [mbox](
				environment_t &,
				const std::string & coop_name )
				{
					mbox->deliver_message( new msg_coop_registered( coop_name ) );
				};
	}